

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DivideTest.h
# Opt level: O2

short __thiscall DivideTest<short>::get_random(DivideTest<short> *this)

{
  ushort uVar1;
  UT UVar2;
  uint uVar3;
  ushort uVar4;
  
  uVar3 = this->seed * 0x19660d + 0x3c6ef35f;
  this->seed = uVar3;
  uVar1 = (ushort)*(undefined4 *)&this->rand_n;
  uVar4 = ((short)(uVar3 & 1) + 2) * uVar1 + 3;
  if (uVar4 < uVar1) {
    uVar4 = (UT)((ulong)uVar3 % 0x13);
  }
  this->rand_n = uVar4;
  UVar2 = -uVar4;
  if ((uVar3 & 1) == 0) {
    UVar2 = uVar4;
  }
  return UVar2;
}

Assistant:

T get_random() {
        // https://en.wikipedia.org/wiki/Linear_congruential_generator
        seed = seed * 1664525 + 1013904223;

        UT old = rand_n;
        rand_n = rand_n * (seed % 2 + 1) + rand_n % 30000001 + 3;

        // Reset upon integer overflow
        if (rand_n < old) {
            rand_n = seed % 19;
        }

        // The algorithm above generates mostly positive numbers.
        // Hence convert 50% of all values to negative.
        if (limits::is_signed) {
            if (seed % 2) return -(T)rand_n;
        }

        return (T)rand_n;
    }